

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getfloat(HSQUIRRELVM v,SQInteger idx,SQFloat *f)

{
  SQObjectPtr *pSVar1;
  SQFloat *in_RDX;
  SQFloat SVar2;
  SQObjectPtr *o;
  SQInteger in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SQRESULT local_8;
  
  pSVar1 = stack_get((HSQUIRRELVM)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  if (((pSVar1->super_SQObject)._type & 0x4000000) == 0) {
    local_8 = -1;
  }
  else {
    if ((pSVar1->super_SQObject)._type == OT_INTEGER) {
      SVar2 = (SQFloat)(pSVar1->super_SQObject)._unVal.nInteger;
    }
    else {
      SVar2 = (pSVar1->super_SQObject)._unVal.fFloat;
    }
    *in_RDX = SVar2;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQRESULT sq_getfloat(HSQUIRRELVM v,SQInteger idx,SQFloat *f)
{
    SQObjectPtr &o = stack_get(v, idx);
    if(sq_isnumeric(o)) {
        *f = tofloat(o);
        return SQ_OK;
    }
    return SQ_ERROR;
}